

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void MIR_gen_set_debug_level(MIR_context_t ctx,int level)

{
  byte *pbVar1;
  gvn_ctx **ppgVar2;
  MIR_insn_code_t MVar3;
  MIR_context_t pMVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  target_ctx **pptVar18;
  gen_ctx_t gen_ctx;
  VARR_void_ptr_t *pVVar19;
  void_ptr_t *ppvVar20;
  VARR_MIR_op_t *pVVar21;
  MIR_op_t *pMVar22;
  VARR_MIR_insn_t *pVVar23;
  MIR_insn_t_conflict *ppMVar24;
  VARR_bb_insn_t *pVVar25;
  bb_insn_t_conflict *ppbVar26;
  VARR_loop_node_t *pVVar27;
  loop_node_t_conflict *pplVar28;
  VARR_mem_attr_t *pVVar29;
  mem_attr_t *pmVar30;
  VARR_target_bb_version_t *pVVar31;
  target_bb_version_t *pptVar32;
  VARR_spot_attr_t *pVVar33;
  spot_attr_t *psVar34;
  bitmap_t pVVar35;
  bitmap_el_t *pbVar36;
  data_flow_ctx *pdVar37;
  VARR_bb_t *pVVar38;
  bb_t_conflict *ppbVar39;
  ssa_ctx *psVar40;
  HTAB_def_tab_el_t *pHVar41;
  gen_ctx_t gen_ctx_00;
  MIR_item_t pMVar42;
  VARR_htab_ind_t *pVVar43;
  htab_ind_t *phVar44;
  ulong uVar45;
  VARR_ssa_edge_t *pVVar46;
  ssa_edge_t_conflict *ppsVar47;
  VARR_size_t *pVVar48;
  size_t *psVar49;
  VARR_char *pVVar50;
  gvn_ctx *pgVar51;
  VARR_expr_t *pVVar52;
  expr_t *ppeVar53;
  HTAB_expr_t *pHVar54;
  VARR_HTAB_EL_expr_t *pVVar55;
  HTAB_EL_expr_t *pHVar56;
  MIR_insn_t_conflict pMVar57;
  VARR_mem_expr_t *pVVar58;
  mem_expr_t *ppmVar59;
  HTAB_mem_expr_t *pHVar60;
  VARR_HTAB_EL_mem_expr_t *pVVar61;
  HTAB_EL_mem_expr_t *pHVar62;
  VARR_insn_nop_pair_t *pVVar63;
  insn_nop_pair_t *piVar64;
  lr_ctx *plVar65;
  VARR_int *pVVar66;
  int *piVar67;
  VARR_MIR_reg_t *pVVar68;
  MIR_reg_t *pMVar69;
  VARR_live_range_t *pVVar70;
  live_range_t_conflict *pplVar71;
  coalesce_ctx *pcVar72;
  VARR_mv_t *pVVar73;
  mv_t *pmVar74;
  ra_ctx *prVar75;
  VARR_allocno_info_t *pVVar76;
  allocno_info_t *paVar77;
  VARR_bitmap_t *pVVar78;
  bitmap_t *ppVVar79;
  VARR_lr_gap_t *pVVar80;
  lr_gap_t *plVar81;
  VARR_spill_el_t *pVVar82;
  spill_el_t *psVar83;
  long lVar84;
  HTAB_lr_gap_t *pHVar85;
  VARR_HTAB_EL_lr_gap_t *pVVar86;
  HTAB_EL_lr_gap_t *pHVar87;
  VARR_spill_cache_el_t *pVVar88;
  spill_cache_el_t *psVar89;
  combine_ctx *pcVar90;
  VARR_var_ref_t *pVVar91;
  var_ref_t *pvVar92;
  target_ctx *ptVar93;
  VARR_uint8_t *pVVar94;
  uint8_t *puVar95;
  VARR_uint64_t *pVVar96;
  uint64_t *puVar97;
  VARR_const_ref_t *pVVar98;
  const_ref_t *pcVar99;
  VARR_label_ref_t *pVVar100;
  label_ref_t *plVar101;
  VARR_MIR_code_reloc_t *pVVar102;
  MIR_code_reloc_t *pMVar103;
  VARR_call_ref_t *pVVar104;
  call_ref_t *pcVar105;
  uint64_t uVar106;
  byte *pbVar107;
  VARR_insn_pattern_info_t *pVVar108;
  insn_pattern_info_t *piVar109;
  void *pvVar110;
  uint uVar111;
  size_t sVar112;
  int iVar113;
  size_t sVar114;
  MIR_insn_code_t MVar115;
  char *pcVar116;
  int iVar117;
  byte bVar118;
  ra_ctx **pprVar119;
  bool bVar120;
  MIR_op_t MStack_d8;
  target_ctx **pptStack_a8;
  MIR_context_t pMStack_a0;
  MIR_context_t pMStack_98;
  long lStack_90;
  pattern *ppStack_88;
  MIR_type_t MStack_7c;
  MIR_var_t aMStack_78 [2];
  
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->debug_level = level;
    return;
  }
  MIR_gen_set_debug_level_cold_1();
  if (ctx->gen_ctx != (gen_ctx *)0x0) {
    ctx->gen_ctx->optimize_level = level;
    return;
  }
  MIR_gen_set_optimize_level_cold_1();
  gen_ctx = (gen_ctx_t)malloc(0x200);
  if (gen_ctx == (gen_ctx_t)0x0) {
    util_error((gen_ctx_t)0x0,"no memory");
  }
  ctx->gen_ctx = gen_ctx;
  gen_ctx->ctx = ctx;
  gen_ctx->optimize_level = 2;
  gen_ctx->debug_file = (FILE *)0x0;
  gen_ctx->target_ctx = (target_ctx *)0x0;
  gen_ctx->data_flow_ctx = (data_flow_ctx *)0x0;
  gen_ctx->gvn_ctx = (gvn_ctx *)0x0;
  gen_ctx->lr_ctx = (lr_ctx *)0x0;
  gen_ctx->ra_ctx = (ra_ctx *)0x0;
  gen_ctx->combine_ctx = (combine_ctx *)0x0;
  gen_ctx->debug_level = 100;
  pVVar19 = (VARR_void_ptr_t *)malloc(0x18);
  gen_ctx->to_free = pVVar19;
  pVVar19->els_num = 0;
  pVVar19->size = 0x40;
  ppvVar20 = (void_ptr_t *)malloc(0x200);
  pVVar19->varr = ppvVar20;
  gen_ctx->addr_insn_p = 0;
  pVVar21 = (VARR_MIR_op_t *)malloc(0x18);
  gen_ctx->temp_ops = pVVar21;
  pVVar21->els_num = 0;
  pVVar21->size = 0x10;
  pMVar22 = (MIR_op_t *)malloc(0x300);
  pVVar21->varr = pMVar22;
  pVVar23 = (VARR_MIR_insn_t *)malloc(0x18);
  gen_ctx->temp_insns = pVVar23;
  pVVar23->els_num = 0;
  pVVar23->size = 0x10;
  ppMVar24 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar23->varr = ppMVar24;
  pVVar23 = (VARR_MIR_insn_t *)malloc(0x18);
  gen_ctx->temp_insns2 = pVVar23;
  pVVar23->els_num = 0;
  pVVar23->size = 0x10;
  ppMVar24 = (MIR_insn_t_conflict *)malloc(0x80);
  pVVar23->varr = ppMVar24;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  gen_ctx->temp_bb_insns = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x10;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar25->varr = ppbVar26;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  gen_ctx->temp_bb_insns2 = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x10;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x80);
  pVVar25->varr = ppbVar26;
  pVVar27 = (VARR_loop_node_t *)malloc(0x18);
  gen_ctx->loop_nodes = pVVar27;
  pVVar27->els_num = 0;
  pVVar27->size = 0x20;
  pplVar28 = (loop_node_t_conflict *)malloc(0x100);
  pVVar27->varr = pplVar28;
  pVVar27 = (VARR_loop_node_t *)malloc(0x18);
  gen_ctx->queue_nodes = pVVar27;
  pVVar27->els_num = 0;
  pVVar27->size = 0x20;
  pplVar28 = (loop_node_t_conflict *)malloc(0x100);
  pVVar27->varr = pplVar28;
  pVVar27 = (VARR_loop_node_t *)malloc(0x18);
  gen_ctx->loop_entries = pVVar27;
  pVVar27->els_num = 0;
  pVVar27->size = 0x10;
  pplVar28 = (loop_node_t_conflict *)malloc(0x80);
  pVVar27->varr = pplVar28;
  pVVar29 = (VARR_mem_attr_t *)malloc(0x18);
  gen_ctx->mem_attrs = pVVar29;
  pVVar29->els_num = 0;
  pVVar29->size = 0x20;
  pmVar30 = (mem_attr_t *)malloc(0x400);
  pVVar29->varr = pmVar30;
  pVVar31 = (VARR_target_bb_version_t *)malloc(0x18);
  gen_ctx->target_succ_bb_versions = pVVar31;
  pVVar31->els_num = 0;
  pVVar31->size = 0x10;
  pptVar32 = (target_bb_version_t *)malloc(0x80);
  pVVar31->varr = pptVar32;
  pVVar19 = (VARR_void_ptr_t *)malloc(0x18);
  gen_ctx->succ_bb_addrs = pVVar19;
  pVVar19->els_num = 0;
  pVVar19->size = 0x10;
  ppvVar20 = (void_ptr_t *)malloc(0x80);
  pVVar19->varr = ppvVar20;
  pVVar33 = (VARR_spot_attr_t *)malloc(0x18);
  gen_ctx->spot_attrs = pVVar33;
  pVVar33->els_num = 0;
  pVVar33->size = 0x20;
  psVar34 = (spot_attr_t *)malloc(0x200);
  pVVar33->varr = psVar34;
  pVVar33 = (VARR_spot_attr_t *)malloc(0x18);
  gen_ctx->spot2attr = pVVar33;
  pVVar33->els_num = 0;
  pVVar33->size = 0x20;
  psVar34 = (spot_attr_t *)malloc(0x200);
  pVVar33->varr = psVar34;
  pVVar35 = (bitmap_t)malloc(0x18);
  pVVar35->els_num = 0;
  pVVar35->size = 4;
  pbVar36 = (bitmap_el_t *)malloc(0x20);
  pVVar35->varr = pbVar36;
  gen_ctx->temp_bitmap = pVVar35;
  pVVar35 = (bitmap_t)malloc(0x18);
  pVVar35->els_num = 0;
  pVVar35->size = 4;
  pbVar36 = (bitmap_el_t *)malloc(0x20);
  pVVar35->varr = pbVar36;
  gen_ctx->temp_bitmap2 = pVVar35;
  pVVar35 = (bitmap_t)malloc(0x18);
  pVVar35->els_num = 0;
  pVVar35->size = 4;
  pbVar36 = (bitmap_el_t *)malloc(0x20);
  pVVar35->varr = pbVar36;
  gen_ctx->temp_bitmap3 = pVVar35;
  (gen_ctx->free_dead_vars).head = (dead_var_t_conflict)0x0;
  (gen_ctx->free_dead_vars).tail = (dead_var_t_conflict)0x0;
  pdVar37 = (data_flow_ctx *)malloc(0x18);
  if (pdVar37 == (data_flow_ctx *)0x0) {
LAB_00151823:
    util_error(gen_ctx,"no memory");
  }
  gen_ctx->data_flow_ctx = pdVar37;
  pVVar38 = (VARR_bb_t *)malloc(0x18);
  pdVar37->worklist = pVVar38;
  pVVar38->els_num = 0;
  pVVar38->size = 0x40;
  ppbVar39 = (bb_t_conflict *)malloc(0x200);
  pVVar38->varr = ppbVar39;
  pVVar38 = (VARR_bb_t *)malloc(0x18);
  pdVar37->pending = pVVar38;
  pVVar38->els_num = 0;
  pVVar38->size = 0x40;
  ppbVar39 = (bb_t_conflict *)malloc(0x200);
  pVVar38->varr = ppbVar39;
  pVVar35 = (bitmap_t)malloc(0x18);
  pVVar35->els_num = 0;
  pVVar35->size = 8;
  pbVar36 = (bitmap_el_t *)malloc(0x40);
  pVVar35->varr = pbVar36;
  pdVar37->bb_to_consider = pVVar35;
  psVar40 = (ssa_ctx *)malloc(0x40);
  if (psVar40 == (ssa_ctx *)0x0) goto LAB_00151823;
  gen_ctx->ssa_ctx = psVar40;
  pMStack_a0 = ctx;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  psVar40->arg_bb_insns = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x40;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar25->varr = ppbVar26;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  psVar40->undef_insns = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x40;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar25->varr = ppbVar26;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  psVar40->phis = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x40;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar25->varr = ppbVar26;
  pVVar25 = (VARR_bb_insn_t *)malloc(0x18);
  psVar40->deleted_phis = pVVar25;
  pVVar25->els_num = 0;
  pVVar25->size = 0x40;
  ppbVar26 = (bb_insn_t_conflict *)malloc(0x200);
  pVVar25->varr = ppbVar26;
  pcVar116 = (char *)0x40;
  pHVar41 = (HTAB_def_tab_el_t *)malloc(0x40);
  if (pHVar41 == (HTAB_def_tab_el_t *)0x0) goto LAB_0015181e;
  gen_ctx_00 = (gen_ctx_t)malloc(0x18);
  pHVar41->els = (VARR_HTAB_EL_def_tab_el_t *)gen_ctx_00;
  gen_ctx_00->ctx = (MIR_context_t)0x0;
  *(size_t *)&gen_ctx_00->optimize_level = 0x400;
  pMVar42 = (MIR_item_t)malloc(0x8000);
  gen_ctx_00->curr_func_item = pMVar42;
  if (pMVar42 == (MIR_item_t)0x0) {
    MIR_gen_init_cold_14();
LAB_00151845:
    util_error(gen_ctx_00,"no memory");
  }
  pptStack_a8 = &gen_ctx->target_ctx;
  ppgVar2 = &gen_ctx->gvn_ctx;
  pprVar119 = &gen_ctx->ra_ctx;
  *(size_t *)&gen_ctx_00->optimize_level = 0x400;
  gen_ctx_00->ctx = (MIR_context_t)0x400;
  pVVar43 = (VARR_htab_ind_t *)malloc(0x18);
  pHVar41->entries = pVVar43;
  pVVar43->els_num = 0;
  pVVar43->size = 0x800;
  phVar44 = (htab_ind_t *)malloc(0x2000);
  pVVar43->varr = phVar44;
  pHVar41->arg = gen_ctx;
  pHVar41->hash_func = def_tab_el_hash;
  pHVar41->eq_func = def_tab_el_eq;
  pHVar41->free_func = (_func_void_def_tab_el_t_void_ptr *)0x0;
  pHVar41->els_num = 0;
  pHVar41->els_start = 0;
  pHVar41->els_bound = 0;
  pHVar41->collisions = 0;
  iVar113 = 0x800;
  do {
    pVVar43 = pHVar41->entries;
    if (pVVar43->varr == (htab_ind_t *)0x0) goto LAB_001517ef;
    uVar45 = pVVar43->els_num + 1;
    if (pVVar43->size < uVar45) {
      sVar112 = (uVar45 >> 1) + uVar45;
      phVar44 = (htab_ind_t *)realloc(pVVar43->varr,sVar112 * 4);
      pVVar43->varr = phVar44;
      pVVar43->size = sVar112;
    }
    sVar112 = pVVar43->els_num;
    pVVar43->els_num = sVar112 + 1;
    pVVar43->varr[sVar112] = 0xffffffff;
    iVar113 = iVar113 + -1;
  } while (iVar113 != 0);
  psVar40->def_tab = pHVar41;
  psVar40 = gen_ctx->ssa_ctx;
  pVVar46 = (VARR_ssa_edge_t *)malloc(0x18);
  psVar40->ssa_edges_to_process = pVVar46;
  pVVar46->els_num = 0;
  pVVar46->size = 0x200;
  ppsVar47 = (ssa_edge_t_conflict *)malloc(0x1000);
  pVVar46->varr = ppsVar47;
  psVar40 = gen_ctx->ssa_ctx;
  pVVar48 = (VARR_size_t *)malloc(0x18);
  psVar40->curr_reg_indexes = pVVar48;
  pVVar48->els_num = 0;
  pVVar48->size = 0x1000;
  psVar49 = (size_t *)malloc(0x8000);
  pVVar48->varr = psVar49;
  psVar40 = gen_ctx->ssa_ctx;
  pVVar50 = (VARR_char *)malloc(0x18);
  psVar40->reg_name = pVVar50;
  pVVar50->els_num = 0;
  pVVar50->size = 0x14;
  pcVar116 = (char *)malloc(0x14);
  pVVar50->varr = pcVar116;
  pMVar4 = gen_ctx->ctx;
  pgVar51 = (gvn_ctx *)malloc(0x30);
  gen_ctx_00 = gen_ctx;
  if (pgVar51 == (gvn_ctx *)0x0) goto LAB_00151845;
  *ppgVar2 = pgVar51;
  pVVar52 = (VARR_expr_t *)malloc(0x18);
  pgVar51->exprs = pVVar52;
  pVVar52->els_num = 0;
  pVVar52->size = 0x200;
  ppeVar53 = (expr_t *)malloc(0x1000);
  pVVar52->varr = ppeVar53;
  pcVar116 = (char *)0x40;
  pHVar54 = (HTAB_expr_t *)malloc(0x40);
  if (pHVar54 == (HTAB_expr_t *)0x0) {
LAB_0015181e:
    mir_htab_error(pcVar116);
  }
  pVVar55 = (VARR_HTAB_EL_expr_t *)malloc(0x18);
  pHVar54->els = pVVar55;
  pVVar55->els_num = 0;
  pVVar55->size = 0x400;
  pHVar56 = (HTAB_EL_expr_t *)malloc(0x4000);
  pVVar55->varr = pHVar56;
  if (pHVar56 == (HTAB_EL_expr_t *)0x0) {
    MIR_gen_init_cold_12();
LAB_00151859:
    MIR_gen_init_cold_10();
  }
  else {
    pVVar55->size = 0x400;
    pVVar55->els_num = 0x400;
    pVVar43 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar54->entries = pVVar43;
    pVVar43->els_num = 0;
    pVVar43->size = 0x800;
    phVar44 = (htab_ind_t *)malloc(0x2000);
    pVVar43->varr = phVar44;
    pHVar54->arg = gen_ctx;
    pHVar54->hash_func = expr_hash;
    pHVar54->eq_func = expr_eq;
    pHVar54->free_func = (_func_void_expr_t_void_ptr *)0x0;
    pHVar54->els_num = 0;
    pHVar54->els_start = 0;
    pHVar54->els_bound = 0;
    pHVar54->collisions = 0;
    iVar113 = 0x800;
    do {
      pVVar43 = pHVar54->entries;
      if (pVVar43->varr == (htab_ind_t *)0x0) goto LAB_001517f4;
      uVar45 = pVVar43->els_num + 1;
      if (pVVar43->size < uVar45) {
        sVar112 = (uVar45 >> 1) + uVar45;
        phVar44 = (htab_ind_t *)realloc(pVVar43->varr,sVar112 * 4);
        pVVar43->varr = phVar44;
        pVVar43->size = sVar112;
      }
      sVar112 = pVVar43->els_num;
      pVVar43->els_num = sVar112 + 1;
      pVVar43->varr[sVar112] = 0xffffffff;
      iVar113 = iVar113 + -1;
    } while (iVar113 != 0);
    pgVar51->expr_tab = pHVar54;
    _MIR_new_var_mem_op(&MStack_d8,pMVar4,MIR_T_I64,0,0xffffffff,0xffffffff,'\0');
    _MIR_new_var_op(pMVar4,0);
    pMVar57 = MIR_new_insn(pMVar4,MIR_MOV);
    pgVar51 = *ppgVar2;
    pgVar51->temp_mem_insn = pMVar57;
    pVVar58 = (VARR_mem_expr_t *)malloc(0x18);
    pgVar51->mem_exprs = pVVar58;
    pVVar58->els_num = 0;
    pVVar58->size = 0x100;
    ppmVar59 = (mem_expr_t *)malloc(0x800);
    pVVar58->varr = ppmVar59;
    pgVar51 = *ppgVar2;
    pcVar116 = (char *)0x40;
    pHVar60 = (HTAB_mem_expr_t *)malloc(0x40);
    if (pHVar60 == (HTAB_mem_expr_t *)0x0) goto LAB_0015181e;
    pVVar61 = (VARR_HTAB_EL_mem_expr_t *)malloc(0x18);
    pHVar60->els = pVVar61;
    pVVar61->els_num = 0;
    pVVar61->size = 0x200;
    pHVar62 = (HTAB_EL_mem_expr_t *)malloc(0x2000);
    pVVar61->varr = pHVar62;
    if (pHVar62 == (HTAB_EL_mem_expr_t *)0x0) goto LAB_00151859;
    pVVar61->size = 0x200;
    pVVar61->els_num = 0x200;
    pVVar43 = (VARR_htab_ind_t *)malloc(0x18);
    pHVar60->entries = pVVar43;
    pVVar43->els_num = 0;
    pVVar43->size = 0x400;
    phVar44 = (htab_ind_t *)malloc(0x1000);
    pVVar43->varr = phVar44;
    pHVar60->arg = gen_ctx;
    pHVar60->hash_func = mem_expr_hash;
    pHVar60->eq_func = mem_expr_eq;
    pHVar60->free_func = (_func_void_mem_expr_t_void_ptr *)0x0;
    pHVar60->els_num = 0;
    pHVar60->els_start = 0;
    pHVar60->els_bound = 0;
    pHVar60->collisions = 0;
    iVar113 = 0x400;
    do {
      pVVar43 = pHVar60->entries;
      if (pVVar43->varr == (htab_ind_t *)0x0) goto LAB_001517f9;
      uVar45 = pVVar43->els_num + 1;
      if (pVVar43->size < uVar45) {
        sVar112 = (uVar45 >> 1) + uVar45;
        phVar44 = (htab_ind_t *)realloc(pVVar43->varr,sVar112 * 4);
        pVVar43->varr = phVar44;
        pVVar43->size = sVar112;
      }
      sVar112 = pVVar43->els_num;
      pVVar43->els_num = sVar112 + 1;
      pVVar43->varr[sVar112] = 0xffffffff;
      iVar113 = iVar113 + -1;
    } while (iVar113 != 0);
    pgVar51->mem_expr_tab = pHVar60;
    pgVar51 = *ppgVar2;
    pVVar63 = (VARR_insn_nop_pair_t *)malloc(0x18);
    pgVar51->insn_nop_pairs = pVVar63;
    pVVar63->els_num = 0;
    pVVar63->size = 0x10;
    piVar64 = (insn_nop_pair_t *)malloc(0x100);
    pVVar63->varr = piVar64;
    plVar65 = (lr_ctx *)malloc(0x68);
    if (plVar65 == (lr_ctx *)0x0) {
LAB_0015180d:
      util_error(gen_ctx,"no memory");
    }
    gen_ctx->lr_ctx = plVar65;
    pVVar66 = (VARR_int *)malloc(0x18);
    plVar65->var_to_scan_var_map = pVVar66;
    pVVar66->els_num = 0;
    pVVar66->size = 0x40;
    piVar67 = (int *)malloc(0x100);
    pVVar66->varr = piVar67;
    pVVar68 = (VARR_MIR_reg_t *)malloc(0x18);
    plVar65->scan_var_to_var_map = pVVar68;
    pVVar68->els_num = 0;
    pVVar68->size = 0x40;
    pMVar69 = (MIR_reg_t *)malloc(0x100);
    pVVar68->varr = pMVar69;
    pVVar70 = (VARR_live_range_t *)malloc(0x18);
    plVar65->free_lr_list = (live_range_t_conflict)0x0;
    plVar65->free_lr_bb_list = (lr_bb_t_conflict)0x0;
    plVar65->var_live_ranges = pVVar70;
    pVVar70->els_num = 0;
    pVVar70->size = 0x40;
    pplVar71 = (live_range_t_conflict *)malloc(0x200);
    pVVar70->varr = pplVar71;
    pVVar66 = (VARR_int *)malloc(0x18);
    plVar65->point_map = pVVar66;
    pVVar66->els_num = 0;
    pVVar66->size = 0x400;
    piVar67 = (int *)malloc(0x1000);
    pVVar66->varr = piVar67;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 4;
    pbVar36 = (bitmap_el_t *)malloc(0x20);
    pVVar35->varr = pbVar36;
    plVar65->live_vars = pVVar35;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 4;
    pbVar36 = (bitmap_el_t *)malloc(0x20);
    pVVar35->varr = pbVar36;
    plVar65->referenced_vars = pVVar35;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 4;
    pbVar36 = (bitmap_el_t *)malloc(0x20);
    pVVar35->varr = pbVar36;
    plVar65->points_with_born_vars = pVVar35;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 4;
    pbVar36 = (bitmap_el_t *)malloc(0x20);
    pVVar35->varr = pbVar36;
    plVar65->points_with_dead_vars = pVVar35;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 4;
    pbVar36 = (bitmap_el_t *)malloc(0x20);
    pVVar35->varr = pbVar36;
    plVar65->points_with_born_or_dead_vars = pVVar35;
    pcVar72 = (coalesce_ctx *)malloc(0x20);
    if (pcVar72 == (coalesce_ctx *)0x0) goto LAB_0015180d;
    gen_ctx->coalesce_ctx = pcVar72;
    pVVar73 = (VARR_mv_t *)malloc(0x18);
    pcVar72->moves = pVVar73;
    pVVar73->els_num = 0;
    pVVar73->size = 0x40;
    pmVar74 = (mv_t *)malloc(0x400);
    pVVar73->varr = pmVar74;
    pVVar68 = (VARR_MIR_reg_t *)malloc(0x18);
    pcVar72->first_coalesced_reg = pVVar68;
    pVVar68->els_num = 0;
    pVVar68->size = 0x40;
    pMVar69 = (MIR_reg_t *)malloc(0x100);
    pVVar68->varr = pMVar69;
    pVVar68 = (VARR_MIR_reg_t *)malloc(0x18);
    pcVar72->next_coalesced_reg = pVVar68;
    pVVar68->els_num = 0;
    pVVar68->size = 0x40;
    pMVar69 = (MIR_reg_t *)malloc(0x100);
    pVVar68->varr = pMVar69;
    pVVar35 = (bitmap_t)malloc(0x18);
    pVVar35->els_num = 0;
    pVVar35->size = 0x40;
    pbVar36 = (bitmap_el_t *)malloc(0x200);
    pVVar35->varr = pbVar36;
    pcVar72->conflict_matrix = pVVar35;
    prVar75 = (ra_ctx *)malloc(0x248);
    if (prVar75 == (ra_ctx *)0x0) goto LAB_0015180d;
    *pprVar119 = prVar75;
    pVVar68 = (VARR_MIR_reg_t *)malloc(0x18);
    prVar75->reg_renumber = pVVar68;
    pVVar68->els_num = 0;
    pVVar68->size = 0x40;
    pMVar69 = (MIR_reg_t *)malloc(0x100);
    pVVar68->varr = pMVar69;
    pVVar76 = (VARR_allocno_info_t *)malloc(0x18);
    prVar75->sorted_regs = pVVar76;
    pVVar76->els_num = 0;
    pVVar76->size = 0x40;
    paVar77 = (allocno_info_t *)malloc(0x400);
    pVVar76->varr = paVar77;
    pVVar78 = (VARR_bitmap_t *)malloc(0x18);
    prVar75->used_locs = pVVar78;
    pVVar78->els_num = 0;
    pVVar78->size = 0x40;
    ppVVar79 = (bitmap_t *)malloc(0x200);
    pVVar78->varr = ppVVar79;
    pVVar78 = (VARR_bitmap_t *)malloc(0x18);
    prVar75->busy_used_locs = pVVar78;
    pVVar78->els_num = 0;
    pVVar78->size = 0x40;
    ppVVar79 = (bitmap_t *)malloc(0x200);
    pVVar78->varr = ppVVar79;
    pVVar78 = (VARR_bitmap_t *)malloc(0x18);
    prVar75->var_bbs = pVVar78;
    pVVar78->els_num = 0;
    pVVar78->size = 0x40;
    ppVVar79 = (bitmap_t *)malloc(0x200);
    pVVar78->varr = ppVVar79;
    pVVar80 = (VARR_lr_gap_t *)malloc(0x18);
    prVar75->spill_gaps = pVVar80;
    pVVar80->els_num = 0;
    pVVar80->size = 0x40;
    plVar81 = (lr_gap_t *)malloc(0x400);
    pVVar80->varr = plVar81;
    pVVar80 = (VARR_lr_gap_t *)malloc(0x18);
    prVar75->curr_gaps = pVVar80;
    pVVar80->els_num = 0;
    pVVar80->size = 0x40;
    plVar81 = (lr_gap_t *)malloc(0x400);
    pVVar80->varr = plVar81;
    pVVar82 = (VARR_spill_el_t *)malloc(0x18);
    prVar75->spill_els = pVVar82;
    pVVar82->els_num = 0;
    pVVar82->size = 0x40;
    psVar83 = (spill_el_t *)malloc(0x400);
    pVVar82->varr = psVar83;
    lVar84 = 8;
    do {
      (*pprVar119)->lr_gap_bitmaps[lVar84 + -8] = (bitmap_t)0x0;
      lVar84 = lVar84 + 1;
    } while (lVar84 != 0x2a);
    prVar75 = *pprVar119;
    pcVar116 = (char *)0x40;
    pHVar85 = (HTAB_lr_gap_t *)malloc(0x40);
    if (pHVar85 == (HTAB_lr_gap_t *)0x0) goto LAB_0015181e;
    pVVar86 = (VARR_HTAB_EL_lr_gap_t *)malloc(0x18);
    pHVar85->els = pVVar86;
    pVVar86->els_num = 0;
    pVVar86->size = 0x400;
    pHVar87 = (HTAB_EL_lr_gap_t *)malloc(0x6000);
    pVVar86->varr = pHVar87;
    if (pHVar87 != (HTAB_EL_lr_gap_t *)0x0) {
      pVVar86->size = 0x400;
      pVVar86->els_num = 0x400;
      pVVar43 = (VARR_htab_ind_t *)malloc(0x18);
      pHVar85->entries = pVVar43;
      pVVar43->els_num = 0;
      pVVar43->size = 0x800;
      phVar44 = (htab_ind_t *)malloc(0x2000);
      pVVar43->varr = phVar44;
      pHVar85->arg = (void *)0x0;
      pHVar85->hash_func = lr_gap_hash;
      pHVar85->eq_func = lr_gap_eq;
      pHVar85->free_func = (_func_void_lr_gap_t_void_ptr *)0x0;
      pHVar85->els_num = 0;
      pHVar85->els_start = 0;
      pHVar85->els_bound = 0;
      pHVar85->collisions = 0;
      iVar113 = 0x800;
      do {
        pVVar43 = pHVar85->entries;
        if (pVVar43->varr == (htab_ind_t *)0x0) goto LAB_001517fe;
        uVar45 = pVVar43->els_num + 1;
        if (pVVar43->size < uVar45) {
          sVar112 = (uVar45 >> 1) + uVar45;
          phVar44 = (htab_ind_t *)realloc(pVVar43->varr,sVar112 * 4);
          pVVar43->varr = phVar44;
          pVVar43->size = sVar112;
        }
        sVar112 = pVVar43->els_num;
        pVVar43->els_num = sVar112 + 1;
        pVVar43->varr[sVar112] = 0xffffffff;
        iVar113 = iVar113 + -1;
      } while (iVar113 != 0);
      prVar75->lr_gap_tab = pHVar85;
      prVar75 = *pprVar119;
      pVVar88 = (VARR_spill_cache_el_t *)malloc(0x18);
      prVar75->spill_cache = pVVar88;
      pVVar88->els_num = 0;
      pVVar88->size = 0x40;
      psVar89 = (spill_cache_el_t *)malloc(0x200);
      pVVar88->varr = psVar89;
      prVar75 = *pprVar119;
      prVar75->spill_cache_age = 0;
      pVVar35 = (bitmap_t)malloc(0x18);
      pVVar35->els_num = 0;
      pVVar35->size = 1;
      pbVar36 = (bitmap_el_t *)malloc(8);
      pVVar35->varr = pbVar36;
      prVar75->conflict_locs1 = pVVar35;
      pcVar90 = (combine_ctx *)malloc(0x50);
      if (pcVar90 != (combine_ctx *)0x0) {
        gen_ctx->combine_ctx = pcVar90;
        pcVar90->curr_bb_var_ref_age = 0;
        pVVar48 = (VARR_size_t *)malloc(0x18);
        pcVar90->var_ref_ages = pVVar48;
        pVVar48->els_num = 0;
        pVVar48->size = 0x40;
        psVar49 = (size_t *)malloc(0x200);
        pVVar48->varr = psVar49;
        pVVar91 = (VARR_var_ref_t *)malloc(0x18);
        pcVar90->var_refs = pVVar91;
        pVVar91->els_num = 0;
        pVVar91->size = 0x40;
        pvVar92 = (var_ref_t *)malloc(0x800);
        pVVar91->varr = pvVar92;
        pVVar68 = (VARR_MIR_reg_t *)malloc(0x18);
        pcVar90->insn_vars = pVVar68;
        pVVar68->els_num = 0;
        pVVar68->size = 0x40;
        pMVar69 = (MIR_reg_t *)malloc(0x100);
        pVVar68->varr = pMVar69;
        pVVar48 = (VARR_size_t *)malloc(0x18);
        pcVar90->changed_op_numbers = pVVar48;
        pVVar48->els_num = 0;
        pVVar48->size = 0x10;
        psVar49 = (size_t *)malloc(0x80);
        pVVar48->varr = psVar49;
        pVVar21 = (VARR_MIR_op_t *)malloc(0x18);
        pcVar90->last_right_ops = pVVar21;
        pVVar21->els_num = 0;
        pVVar21->size = 0x10;
        pMVar22 = (MIR_op_t *)malloc(0x300);
        pVVar21->varr = pMVar22;
        pVVar35 = (bitmap_t)malloc(0x18);
        pVVar35->els_num = 0;
        pVVar35->size = 0x40;
        pbVar36 = (bitmap_el_t *)malloc(0x200);
        pVVar35->varr = pbVar36;
        pcVar90->vars_bitmap = pVVar35;
        pMVar4 = gen_ctx->ctx;
        ptVar93 = (target_ctx *)malloc(0x68);
        pptVar18 = pptStack_a8;
        if (ptVar93 != (target_ctx *)0x0) {
          *pptStack_a8 = ptVar93;
          pVVar94 = (VARR_uint8_t *)malloc(0x18);
          ptVar93->result_code = pVVar94;
          pVVar94->els_num = 0;
          pVVar94->size = 0x40;
          puVar95 = (uint8_t *)malloc(0x40);
          pVVar94->varr = puVar95;
          pVVar66 = (VARR_int *)malloc(0x18);
          ptVar93->insn_pattern_indexes = pVVar66;
          pVVar66->els_num = 0;
          pVVar66->size = 0x40;
          piVar67 = (int *)malloc(0x100);
          pVVar66->varr = piVar67;
          pVVar96 = (VARR_uint64_t *)malloc(0x18);
          ptVar93->const_pool = pVVar96;
          pVVar96->els_num = 0;
          pVVar96->size = 0x40;
          puVar97 = (uint64_t *)malloc(0x200);
          pVVar96->varr = puVar97;
          pVVar98 = (VARR_const_ref_t *)malloc(0x18);
          ptVar93->const_refs = pVVar98;
          pVVar98->els_num = 0;
          pVVar98->size = 0x40;
          pcVar99 = (const_ref_t *)malloc(0xa00);
          pVVar98->varr = pcVar99;
          pVVar100 = (VARR_label_ref_t *)malloc(0x18);
          ptVar93->label_refs = pVVar100;
          pVVar100->els_num = 0;
          pVVar100->size = 0x40;
          plVar101 = (label_ref_t *)malloc(0x800);
          pVVar100->varr = plVar101;
          pVVar96 = (VARR_uint64_t *)malloc(0x18);
          ptVar93->abs_address_locs = pVVar96;
          pVVar96->els_num = 0;
          pVVar96->size = 0x40;
          puVar97 = (uint64_t *)malloc(0x200);
          pVVar96->varr = puVar97;
          pVVar102 = (VARR_MIR_code_reloc_t *)malloc(0x18);
          ptVar93->relocs = pVVar102;
          pVVar102->els_num = 0;
          pVVar102->size = 0x40;
          pMVar103 = (MIR_code_reloc_t *)malloc(0x400);
          pVVar102->varr = pMVar103;
          pVVar104 = (VARR_call_ref_t *)malloc(0x18);
          ptVar93->call_refs = pVVar104;
          lVar84 = 0;
          pVVar104->els_num = 0;
          pVVar104->size = 0x40;
          pcVar105 = (call_ref_t *)malloc(0x400);
          pVVar104->varr = pcVar105;
          MStack_7c = MIR_T_D;
          aMStack_78[0].size = 0;
          aMStack_78[0].type = MIR_T_D;
          aMStack_78[0]._4_4_ = 0;
          aMStack_78[0].name = "src";
          pMStack_98 = pMVar4;
          _MIR_register_unspec_insn(pMVar4,0,"movdqa",1,&MStack_7c,1,0,aMStack_78);
          ptVar93 = *pptVar18;
          pVVar66 = (VARR_int *)malloc(0x18);
          ptVar93->pattern_indexes = pVVar66;
          pVVar66->els_num = 0;
          pVVar66->size = 0x40;
          piVar67 = (int *)malloc(0x100);
          pVVar66->varr = piVar67;
LAB_00150d18:
          ppStack_88 = patterns + lVar84;
          pbVar107 = (byte *)patterns[lVar84].replacement;
          iVar113 = 0;
          lStack_90 = lVar84;
LAB_00150d42:
          bVar5 = false;
          bVar6 = false;
          bVar7 = false;
          bVar10 = false;
          bVar9 = false;
          bVar11 = false;
          bVar12 = false;
          bVar13 = false;
          bVar14 = false;
          bVar120 = false;
          bVar17 = false;
          bVar15 = false;
          bVar16 = false;
LAB_00150da6:
          lVar84 = lStack_90;
          pptVar18 = pptStack_a8;
          bVar118 = *pbVar107;
          MStack_d8.data = pbVar107;
          if ((bVar118 == 0) || (bVar118 == 0x3b)) goto LAB_001511c8;
          if (((int)(char)bVar118 - 0x30U < 10) ||
             ('6' < (char)bVar118 && (int)(char)bVar118 - 0x41U < 6)) {
            MStack_d8.data = pbVar107 + 1;
            bVar8 = bVar7;
            if (bVar5) {
              if (bVar6) {
                bVar6 = true;
                bVar8 = true;
                if (bVar7) {
                  __assert_fail("!opcode2_p",
                                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                                ,0x90d,"int get_max_insn_size(gen_ctx_t, const char *)");
                }
              }
              else {
                bVar6 = true;
              }
            }
            MStack_d8.data = pbVar107 + 2;
            bVar5 = true;
            bVar7 = bVar8;
          }
          bVar118 = *MStack_d8.data;
          bVar8 = bVar120;
          if (bVar118 < 0x2f) {
            if (bVar118 < 0x20) {
              if (bVar118 != 9) {
                if (bVar118 != 0) goto switchD_00150e4d_caseD_4b;
                goto LAB_001511c8;
              }
            }
            else if (bVar118 != 0x20) {
              if (bVar118 != 0x2b) goto switchD_00150e4d_caseD_4b;
              pbVar107 = (byte *)((long)MStack_d8.data + 1);
              pbVar1 = (byte *)((long)MStack_d8.data + 1);
              if (*pbVar1 != 0x68) {
                bVar5 = true;
                MStack_d8.data = pbVar107;
                if ((byte)(*pbVar1 - 0x30) < 3) goto LAB_001511a6;
                goto LAB_0015178d;
              }
              bVar5 = true;
              MStack_d8.data = (byte *)((long)MStack_d8.data + 2);
            }
            goto LAB_001511a6;
          }
          switch(bVar118) {
          case 0x48:
          case 0x68:
            MStack_d8.data = (void *)((long)MStack_d8.data + 1);
            read_hex((char **)&MStack_d8);
          case 0x71:
            bVar9 = true;
            break;
          case 0x49:
          case 0x4a:
          case 0x69:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            if ((*(byte *)((long)MStack_d8.data + 1) & 0xf8) != 0x30) {
              MStack_d8.data = pbVar107;
              __assert_fail("\'0\' <= ch && ch <= \'7\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x948,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            if (bVar118 == 0x69) {
              bVar14 = true;
              MStack_d8.data = pbVar107;
            }
            else if (bVar118 == 0x49) {
              bVar17 = true;
              MStack_d8.data = pbVar107;
            }
            else {
              bVar15 = true;
              MStack_d8.data = pbVar107;
            }
            break;
          case 0x4b:
          case 0x4d:
          case 0x4e:
          case 0x4f:
          case 0x51:
          case 0x55:
          case 0x57:
          case 0x5b:
          case 0x5c:
          case 0x5d:
          case 0x5e:
          case 0x5f:
          case 0x60:
          case 0x62:
          case 100:
          case 0x65:
          case 0x66:
          case 0x67:
          case 0x6a:
          case 0x6b:
          case 0x6e:
          case 0x6f:
          case 0x70:
          case 0x73:
          case 0x74:
          case 0x75:
switchD_00150e4d_caseD_4b:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                          ,0x988,"int get_max_insn_size(gen_ctx_t, const char *)");
          case 0x4c:
            bVar120 = true;
            goto LAB_001510eb;
          case 0x50:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            pbVar1 = (byte *)((long)MStack_d8.data + 1);
            bVar9 = true;
            MStack_d8.data = pbVar107;
            bVar8 = true;
            if ((*pbVar1 & 0xf8) != 0x30) {
              __assert_fail("\'0\' <= ch && ch <= \'7\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x95c,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            break;
          case 0x52:
          case 0x53:
          case 0x72:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            pbVar1 = (byte *)((long)MStack_d8.data + 1);
            bVar9 = true;
            MStack_d8.data = pbVar107;
            if (2 < (byte)(*pbVar1 - 0x30)) {
              __assert_fail("\'0\' <= ch && ch <= \'2\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x924,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            break;
          case 0x54:
            bVar9 = true;
            bVar16 = true;
            break;
          case 0x56:
          case 0x76:
            MStack_d8.data = (void *)((long)MStack_d8.data + 1);
            read_hex((char **)&MStack_d8);
            if (bVar118 == 0x76) {
              bVar14 = true;
            }
            else {
              bVar17 = true;
            }
            break;
          case 0x58:
          case 0x59:
          case 0x5a:
            if (bVar5) {
              bVar10 = true;
              bVar5 = false;
              bVar12 = true;
              if (bVar6) {
                __assert_fail("!opcode1_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x91a,"int get_max_insn_size(gen_ctx_t, const char *)");
              }
            }
            else {
              bVar10 = true;
              bVar5 = false;
            }
            break;
          case 0x61:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            bVar118 = *(byte *)((long)MStack_d8.data + 1);
            if (bVar118 == 0x70) {
              bVar11 = true;
              MStack_d8.data = pbVar107;
              bVar8 = true;
            }
            else if (bVar118 == 0x6d) {
              bVar11 = true;
              MStack_d8.data = pbVar107;
            }
            else {
              if (bVar118 != 100) {
                MStack_d8.data = pbVar107;
                __assert_fail("ch == \'m\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x941,"int get_max_insn_size(gen_ctx_t, const char *)");
              }
              MStack_d8.data = (void *)((long)MStack_d8.data + 2);
              uVar106 = read_hex((char **)&MStack_d8);
              bVar120 = (long)(char)uVar106 == uVar106;
              if (bVar120) {
                bVar13 = true;
              }
              bVar11 = true;
              if (!bVar120) {
                bVar8 = true;
              }
            }
            break;
          case 99:
            MStack_d8.data = (void *)((long)MStack_d8.data + 1);
            read_hex((char **)&MStack_d8);
            bVar8 = true;
            if (bVar120) {
              __assert_fail("!disp32_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x971,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            break;
          case 0x6c:
            bVar13 = true;
LAB_001510eb:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            pbVar1 = (byte *)((long)MStack_d8.data + 1);
            MStack_d8.data = pbVar107;
            bVar8 = bVar120;
            if (2 < (byte)(*pbVar1 - 0x30)) {
              __assert_fail("\'0\' <= ch && ch <= \'2\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x958,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            break;
          case 0x6d:
            pbVar107 = (byte *)((long)MStack_d8.data + 1);
            pbVar1 = (byte *)((long)MStack_d8.data + 1);
            bVar9 = true;
            MStack_d8.data = pbVar107;
            if ((*pbVar1 | 0x20) == 0x74) {
              bVar11 = true;
              bVar13 = true;
            }
            else {
              bVar11 = true;
              bVar8 = true;
              if (2 < (byte)(*pbVar1 - 0x30)) {
                __assert_fail("\'0\' <= ch && ch <= \'2\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x930,"int get_max_insn_size(gen_ctx_t, const char *)");
              }
            }
            break;
          default:
            if (bVar118 == 0x2f) {
              pbVar107 = (byte *)((long)MStack_d8.data + 1);
              pbVar1 = (byte *)((long)MStack_d8.data + 1);
              bVar9 = true;
              MStack_d8.data = pbVar107;
              if ((*pbVar1 & 0xf8) != 0x30) {
                __assert_fail("\'0\' <= ch && ch <= \'7\'",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                              ,0x962,"int get_max_insn_size(gen_ctx_t, const char *)");
              }
              break;
            }
            if (bVar118 != 0x3b) goto switchD_00150e4d_caseD_4b;
LAB_001511c8:
            iVar117 = ((((((((iVar113 - (uint)!bVar10) - (uint)!bVar9) - (uint)!bVar11) -
                          (uint)!bVar12) - (uint)!bVar13) - (uint)!bVar5) + 8) - (uint)!bVar6) -
                      (uint)!bVar7;
            iVar113 = iVar117 + 4;
            if (!bVar120) {
              iVar113 = iVar117;
            }
            iVar117 = (iVar113 + 1) - (uint)!bVar14;
            iVar113 = iVar117 + 4;
            if (!bVar17) {
              iVar113 = iVar117;
            }
            iVar117 = iVar113 + 8;
            if (!bVar15) {
              iVar117 = iVar113;
            }
            iVar113 = iVar117 + 4;
            if (!bVar16) {
              iVar113 = iVar117;
            }
            if (bVar118 != 0) goto code_r0x00151259;
            ppStack_88->max_insn_size = iVar113;
            pVVar66 = (*pptStack_a8)->pattern_indexes;
            if (pVVar66->varr != (int *)0x0) goto code_r0x00151292;
            goto LAB_00151803;
          }
LAB_001511a6:
          bVar120 = bVar8;
          pbVar107 = (byte *)((long)MStack_d8.data + 1);
          goto LAB_00150da6;
        }
      }
      goto LAB_0015180d;
    }
  }
  MIR_gen_init_cold_8();
LAB_00151863:
  MIR_gen_init_cold_5();
LAB_00151868:
  MIR_gen_init_cold_3();
LAB_0015186d:
  __assert_fail("prev_code != MIR_INSN_BOUND",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                ,0x770,"void patterns_init(gen_ctx_t)");
code_r0x00151292:
  uVar45 = pVVar66->els_num + 1;
  if (pVVar66->size < uVar45) {
    sVar112 = (uVar45 >> 1) + uVar45;
    piVar67 = (int *)realloc(pVVar66->varr,sVar112 * 4);
    pVVar66->varr = piVar67;
    pVVar66->size = sVar112;
  }
  sVar112 = pVVar66->els_num;
  pVVar66->els_num = sVar112 + 1;
  pVVar66->varr[sVar112] = (int)lVar84;
  lVar84 = lVar84 + 1;
  if (lVar84 == 0x2d9) goto code_r0x001512ed;
  goto LAB_00150d18;
code_r0x001512ed:
  if ((*pptVar18)->pattern_indexes == (VARR_int *)0x0) goto LAB_00151863;
  qsort((*pptVar18)->pattern_indexes->varr,0x2d9,4,pattern_index_cmp);
  ptVar93 = *pptVar18;
  pVVar108 = (VARR_insn_pattern_info_t *)malloc(0x18);
  ptVar93->insn_pattern_info = pVVar108;
  pVVar108->els_num = 0;
  pVVar108->size = 0x40;
  piVar109 = (insn_pattern_info_t *)malloc(0x200);
  pVVar108->varr = piVar109;
  iVar113 = 0xbc;
  do {
    pVVar108 = (*pptVar18)->insn_pattern_info;
    if (pVVar108->varr == (insn_pattern_info_t *)0x0) goto LAB_00151808;
    uVar45 = pVVar108->els_num + 1;
    if (pVVar108->size < uVar45) {
      sVar112 = (uVar45 >> 1) + uVar45;
      piVar109 = (insn_pattern_info_t *)realloc(pVVar108->varr,sVar112 * 8);
      pVVar108->varr = piVar109;
      pVVar108->size = sVar112;
    }
    pMVar4 = pMStack_98;
    sVar112 = pVVar108->els_num;
    piVar109 = pVVar108->varr;
    pVVar108->els_num = sVar112 + 1;
    piVar109[sVar112].start = 0;
    piVar109[sVar112].num = 0;
    iVar113 = iVar113 + -1;
  } while (iVar113 != 0);
  pVVar108 = (*pptVar18)->insn_pattern_info;
  if (pVVar108 != (VARR_insn_pattern_info_t *)0x0) {
    pVVar66 = (*pptVar18)->pattern_indexes;
    if ((pVVar66 == (VARR_int *)0x0) || (piVar67 = pVVar66->varr, piVar67 == (int *)0x0)) {
LAB_001517ea:
      MIR_gen_init_cold_2();
LAB_001517ef:
      MIR_gen_init_cold_13();
LAB_001517f4:
      MIR_gen_init_cold_11();
LAB_001517f9:
      MIR_gen_init_cold_9();
LAB_001517fe:
      MIR_gen_init_cold_7();
LAB_00151803:
      MIR_gen_init_cold_6();
LAB_00151808:
      MIR_gen_init_cold_4();
      goto LAB_0015180d;
    }
    piVar109 = pVVar108->varr;
    sVar112 = pVVar66->els_num;
    MVar115 = MIR_INSN_BOUND;
    sVar114 = 0;
    do {
      if (sVar112 == sVar114) goto LAB_001517ea;
      MVar3 = patterns[piVar67[sVar114]].code;
      if (MVar3 != MVar115) {
        if (sVar114 != 0) {
          piVar109[MVar115].num = (int)sVar114 - piVar109[MVar115].start;
        }
        piVar109[MVar3].start = (int)sVar114;
        MVar115 = MVar3;
      }
      sVar114 = sVar114 + 1;
    } while (sVar114 != 0x2d9);
    if (MVar115 != MIR_INSN_BOUND) {
      piVar109[MVar115].num = 0x2d9 - piVar109[MVar115].start;
      uVar111 = 0;
      MIR_new_label_op(pMStack_98,(MIR_label_t)0x0);
      pMVar57 = MIR_new_insn(pMVar4,MIR_JMP);
      gen_ctx->target_ctx->temp_jump = pMVar57;
      iVar113 = find_insn_pattern(gen_ctx,pMVar57,(int *)0x0);
      gen_ctx->target_ctx->temp_jump_pat_ind = iVar113;
      gen_ctx->max_int_hard_regs = 0;
      gen_ctx->max_fp_hard_regs = 0;
      do {
        if ((0x20 < (uVar111 & 0x3e)) || ((0x101000410U >> (uVar111 & 0x3e) & 1) == 0)) {
          if (uVar111 < 0x10) {
            gen_ctx->max_int_hard_regs = gen_ctx->max_int_hard_regs + 1;
          }
          else {
            gen_ctx->max_fp_hard_regs = gen_ctx->max_fp_hard_regs + 1;
          }
        }
        uVar111 = uVar111 + 1;
      } while (uVar111 != 0x22);
      lVar84 = 0;
      do {
        pVVar35 = (bitmap_t)malloc(0x18);
        pVVar35->els_num = 0;
        pVVar35->size = 1;
        pbVar36 = (bitmap_el_t *)malloc(8);
        pVVar35->varr = pbVar36;
        gen_ctx->call_used_hard_regs[lVar84] = pVVar35;
        uVar45 = 0;
        do {
          if (((uint)uVar45 & 0x3c) != 0xc && uVar45 != 3) {
            pVVar35 = gen_ctx->call_used_hard_regs[lVar84];
            bitmap_expand(pVVar35,uVar45 + 1);
            if (pVVar35 == (bitmap_t)0x0) {
              MIR_gen_init_cold_1();
LAB_0015178d:
              __assert_fail("\'0\' <= ch && ch <= \'2\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                            ,0x96a,"int get_max_insn_size(gen_ctx_t, const char *)");
            }
            *pVVar35->varr = *pVVar35->varr | 1L << (uVar45 & 0x3f);
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 != 0x22);
        lVar84 = lVar84 + 1;
        if (lVar84 == 0x13) {
          pVVar35 = (bitmap_t)malloc(0x18);
          pVVar35->els_num = 0;
          pVVar35->size = 4;
          pbVar36 = (bitmap_el_t *)malloc(0x20);
          pVVar35->varr = pbVar36;
          gen_ctx->tied_regs = pVVar35;
          pVVar35 = (bitmap_t)malloc(0x18);
          pVVar35->els_num = 0;
          pVVar35->size = 4;
          pbVar36 = (bitmap_el_t *)malloc(0x20);
          pVVar35->varr = pbVar36;
          gen_ctx->addr_regs = pVVar35;
          pVVar35 = (bitmap_t)malloc(0x18);
          pVVar35->els_num = 0;
          pVVar35->size = 0x10;
          pbVar36 = (bitmap_el_t *)malloc(0x80);
          pVVar35->varr = pbVar36;
          gen_ctx->insn_to_consider = pVVar35;
          pVVar35 = (bitmap_t)malloc(0x18);
          pVVar35->els_num = 0;
          pVVar35->size = 1;
          pbVar36 = (bitmap_el_t *)malloc(8);
          pVVar35->varr = pbVar36;
          gen_ctx->func_used_hard_regs = pVVar35;
          pvVar110 = _MIR_get_bb_wrapper(pMStack_a0,gen_ctx,bb_version_generator);
          gen_ctx->bb_wrapper = pvVar110;
          gen_ctx->overall_bbs_num = 0;
          gen_ctx->overall_gen_bbs_num = 0;
          return;
        }
      } while( true );
    }
    goto LAB_0015186d;
  }
  goto LAB_00151868;
code_r0x00151259:
  pbVar107 = (byte *)((long)MStack_d8.data + 1);
  goto LAB_00150d42;
}

Assistant:

void MIR_gen_set_debug_level (MIR_context_t ctx, int level) {
#if !MIR_NO_GEN_DEBUG
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_set_debug_level before MIR_gen_init -- good bye\n");
    exit (1);
  }
  debug_level = level;
#endif
}